

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exceptions.h
# Opt level: O0

void __thiscall FIX::RepeatedTag::RepeatedTag(RepeatedTag *this,int field,string *what)

{
  allocator<char> local_41;
  string local_40;
  string *local_20;
  string *what_local;
  RepeatedTag *pRStack_10;
  int field_local;
  RepeatedTag *this_local;
  
  local_20 = what;
  what_local._4_4_ = field;
  pRStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Repeated tag not part of repeating group",&local_41);
  Exception::Exception(&this->super_Exception,&local_40,local_20);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  *(undefined ***)&this->super_Exception = &PTR__RepeatedTag_0032f6d8;
  this->field = what_local._4_4_;
  return;
}

Assistant:

RepeatedTag(int field = 0, const std::string &what = "")
      : Exception("Repeated tag not part of repeating group", what),
        field(field) {}